

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestSpecParser * __thiscall Catch::TestSpecParser::parse(TestSpecParser *this,string *arg)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  string local_38 [32];
  string *local_18;
  string *arg_local;
  TestSpecParser *this_local;
  
  this->m_mode = None;
  this->m_exclusion = false;
  this->m_start = 0xffffffffffffffff;
  local_18 = arg;
  arg_local = (string *)this;
  (*this->m_tagAliases->_vptr_ITagAliasRegistry[3])(local_38,this->m_tagAliases,arg);
  std::__cxx11::string::operator=((string *)&this->m_arg,local_38);
  std::__cxx11::string::~string(local_38);
  this->m_pos = 0;
  while( true ) {
    uVar1 = this->m_pos;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar1) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->m_arg);
    visitChar(this,*pcVar3);
    this->m_pos = this->m_pos + 1;
  }
  if (this->m_mode == Name) {
    addPattern<Catch::TestSpec::NamePattern>(this);
  }
  return this;
}

Assistant:

TestSpecParser& parse( std::string const& arg ) {
            m_mode = None;
            m_exclusion = false;
            m_start = std::string::npos;
            m_arg = m_tagAliases->expandAliases( arg );
            for( m_pos = 0; m_pos < m_arg.size(); ++m_pos )
                visitChar( m_arg[m_pos] );
            if( m_mode == Name )
                addPattern<TestSpec::NamePattern>();
            return *this;
        }